

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

void __thiscall
CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
          (CCheckQueueControl<FakeCheckCheckCompletion> *this,
          CCheckQueue<FakeCheckCheckCompletion> *pqueueIn)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->pqueue = pqueueIn;
  this->fDone = false;
  if (pqueueIn != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pqueueIn->m_control_mutex);
    if (iVar2 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_system_error(iVar2);
      }
      goto LAB_003198dc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_003198dc:
  __stack_chk_fail();
}

Assistant:

explicit CCheckQueueControl(CCheckQueue<T> * const pqueueIn) : pqueue(pqueueIn), fDone(false)
    {
        // passed queue is supposed to be unused, or nullptr
        if (pqueue != nullptr) {
            ENTER_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }